

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdi::IconTiler::rearrange(IconTiler *this,QList<QWidget_*> *widgets,QRect *domain)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  QWidgetData *pQVar10;
  QWidget *this_00;
  bool bVar11;
  int iVar12;
  LayoutDirection direction;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  char *where;
  long in_FS_OFFSET;
  uint local_84;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = (widgets->d).size;
  if (lVar9 != 0) {
    bVar11 = sanityCheck((QList<QWidget_*> *)(widgets->d).ptr,(int)lVar9,(char *)0x0);
    if (bVar11) {
      uVar5 = (uint)(widgets->d).size;
      pQVar10 = (*(widgets->d).ptr)->data;
      iVar15 = ((pQVar10->crect).x2.m_i - (pQVar10->crect).x1.m_i) + 1;
      if (iVar15 < 2) {
        iVar15 = 1;
      }
      iVar12 = (((domain->x2).m_i - (domain->x1).m_i) + 1) / iVar15;
      iVar16 = 1;
      if (1 < iVar12) {
        iVar16 = iVar12;
      }
      uVar19 = (uint)((int)uVar5 % iVar16 != 0);
      uVar14 = uVar19 + (int)uVar5 / iVar16;
      if (uVar14 != 0 && SCARRY4(uVar19,(int)uVar5 / iVar16) == (int)uVar14 < 0) {
        iVar12 = (pQVar10->crect).y2.m_i;
        iVar6 = (pQVar10->crect).y1.m_i;
        where = (char *)0x0;
        local_84 = 0;
        do {
          iVar13 = 0;
          iVar17 = iVar16;
          do {
            iVar7 = (domain->y1).m_i;
            iVar8 = (domain->y2).m_i;
            iVar18 = (int)where;
            bVar11 = sanityCheck((QList<QWidget_*> *)(widgets->d).ptr,(int)(widgets->d).size,where);
            if (bVar11) {
              local_48.y1.m_i = (iVar8 + ~local_84 * ((iVar12 - iVar6) + 1) + 1) - iVar7;
              uVar19 = iVar18 + 1;
              where = (char *)(ulong)uVar19;
              this_00 = (widgets->d).ptr[iVar18];
              pQVar10 = this_00->data;
              uVar1 = (pQVar10->crect).x2;
              uVar3 = (pQVar10->crect).y2;
              uVar2 = (pQVar10->crect).x1;
              uVar4 = (pQVar10->crect).y1;
              local_48.x2.m_i = (iVar13 + uVar1) - uVar2;
              local_48.y2.m_i = (local_48.y1.m_i + uVar3) - uVar4;
              local_48.x1.m_i = iVar13;
              direction = QWidget::layoutDirection(this_00);
              local_58 = QStyle::visualRect(direction,domain,&local_48);
              QWidget::setGeometry(this_00,&local_58);
              if (uVar19 == uVar5) goto LAB_0043df7f;
            }
            iVar13 = iVar13 + iVar15;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          local_84 = local_84 + 1;
        } while (local_84 != uVar14);
      }
    }
  }
LAB_0043df7f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IconTiler::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty() || !sanityCheck(widgets, 0, "IconTiler"))
        return;

    const int n = widgets.size();
    const int width = qMax(widgets.at(0)->width(), 1);
    const int height = widgets.at(0)->height();
    const int ncols = qMax(domain.width() / width, 1);
    const int nrows = n / ncols + ((n % ncols) ? 1 : 0);

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = col * width;
            const int y = domain.height() - height - row * height;
            if (!sanityCheck(widgets, i, "IconTiler"))
                continue;
            QWidget *widget = widgets.at(i++);
            QPoint newPos(x, y);
            QRect newGeometry = QRect(newPos.x(), newPos.y(), widget->width(), widget->height());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}